

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O2

Label * __thiscall wabt::ModuleContext::GetLabel(ModuleContext *this,Var *var)

{
  pointer pLVar1;
  __type _Var2;
  string *__rhs;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int in_EDX;
  uint uVar6;
  Label *pLVar7;
  
  if (var->type_ == Name) {
    lVar4 = (((long)(this->label_stack_).
                    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->label_stack_).
                   super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x58 & 0xffffffffU) * 0x58;
    do {
      lVar5 = lVar4;
      if (lVar5 + -0x58 == -0x58) {
        return (Label *)0x0;
      }
      pLVar1 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pLVar1[-1].name._M_dataplus._M_p + lVar5),__rhs);
      lVar4 = lVar5 + -0x58;
    } while (!_Var2);
    pLVar7 = (Label *)((long)&pLVar1[-1].name._M_dataplus._M_p + lVar5);
  }
  else {
    pcVar3 = Var::index(var,(char *)var,in_EDX);
    lVar4 = (long)(this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)(lVar4 / 0x58);
    if ((uint)pcVar3 < uVar6) {
      pcVar3 = Var::index(var,(char *)0x58,(int)(lVar4 % 0x58));
      pLVar7 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
               _M_impl.super__Vector_impl_data._M_start + (~(uint)pcVar3 + uVar6);
    }
    else {
      pLVar7 = (Label *)0x0;
    }
  }
  return pLVar7;
}

Assistant:

const Label* ModuleContext::GetLabel(const Var& var) const {
  if (var.is_name()) {
    for (Index i = GetLabelStackSize(); i > 0; --i) {
      auto label = &label_stack_[i - 1];
      if (label->name == var.name()) {
        return label;
      }
    }
  } else if (var.index() < GetLabelStackSize()) {
    auto label = &label_stack_[GetLabelStackSize() - var.index() - 1];
    return label;
  }
  return nullptr;
}